

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Parser *this;
  bool bVar1;
  ostream *poVar2;
  type *ptVar3;
  undefined1 local_810 [8];
  Decrypt decrypt;
  type *k2_2;
  type *k1_2;
  undefined1 local_540 [8];
  Crypt crypt;
  type *k2_1;
  type *k1_1;
  undefined1 local_270 [8];
  SequenceD<64> k2;
  SequenceD<64> k1;
  undefined1 local_100 [8];
  ParsedOptions options;
  Parser parser;
  char **argv_local;
  int argc_local;
  
  this = (Parser *)((long)&options.outputFile.field_2 + 8);
  Parser::Parser(this,argc,argv);
  Parser::parse((ParsedOptions *)local_100,this);
  if ((local_100[0] & 1U) == 0) {
    switch(local_100._4_4_) {
    case 0:
      break;
    case 1:
      poVar2 = std::operator<<((ostream *)&std::cout,"Usage:");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "       3des [--key-gen] [-i <fichier>] [-c <fichier>] [-d <fichier>] [-O <fichier>]"
                              );
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"Arguments:");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"  --key-gen");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "       Permet de generer une nouvelle clef de chiffrement et l\'affiche sur la sortie standard."
                              );
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"  -i <fichier>");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "       Permet de specifier une clef utilisee pour le chiffrement ou le dechiffrement."
                              );
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"  -c <fichier>");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "       Permet de chiffrer un fichier a l\'aide d\'une clef (specifiee par le flag -i)."
                              );
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "       Par defaut, ecrit le resultat dans la sortie standard.");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"  -d <fichier>");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "       Permet de dechiffrer un fichier a l\'aide d\'une clef (specifiee par le flag -i)."
                              );
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "       Par defaut, ecrit le resultat dans la sortie standard.");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"  -O <fichier>");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "      Permet d\'ecrire le resultat d\'une sous commande vers un nouveau fichier plutot que"
                              );
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"      dans la sortie standard.");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"  -h / --help");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "      Affiche ce message d\'aide et se termine.");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"Exemple:");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "      ./3des -i ~/3des.key -c README.txt > README.3des");
      std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      break;
    case 2:
      SequenceD<64>::SequenceD
                ((SequenceD<64> *)
                 ((long)&k2.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish + 0x18));
      SequenceD<64>::SequenceD((SequenceD<64> *)local_270);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&options.inputFile.field_2 + 8));
      if (bVar1) {
        write3DESKeys((ostream *)&std::cout,
                      (SequenceD<64> *)
                      ((long)&k2.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl
                              .super__Deque_impl_data._M_finish + 0x18),(SequenceD<64> *)local_270);
      }
      else {
        write3DESKeys((string *)((long)&options.inputFile.field_2 + 8),
                      (SequenceD<64> *)
                      ((long)&k2.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl
                              .super__Deque_impl_data._M_finish + 0x18),(SequenceD<64> *)local_270);
      }
      SequenceD<64>::~SequenceD((SequenceD<64> *)local_270);
      SequenceD<64>::~SequenceD
                ((SequenceD<64> *)
                 ((long)&k2.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish + 0x18));
      break;
    case 3:
      read3DESKeys((pair<SequenceD<64>,_SequenceD<64>_> *)&k1_1,(string *)&options);
      ptVar3 = std::get<0ul,SequenceD<64>,SequenceD<64>>
                         ((pair<SequenceD<64>,_SequenceD<64>_> *)&k1_1);
      crypt.m_k2.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node =
           (_Map_pointer)
           std::get<1ul,SequenceD<64>,SequenceD<64>>((pair<SequenceD<64>,_SequenceD<64>_> *)&k1_1);
      Crypt::Crypt((Crypt *)local_540,ptVar3,
                   (SequenceD<64> *)
                   crypt.m_k2.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&options.inputFile.field_2 + 8));
      if (bVar1) {
        Crypt::operator()((Crypt *)local_540,(string *)((long)&options.keyFile.field_2 + 8),
                          (ostream *)&std::cout);
      }
      else {
        Crypt::operator()((Crypt *)local_540,(string *)((long)&options.keyFile.field_2 + 8),
                          (string *)((long)&options.inputFile.field_2 + 8));
      }
      Crypt::~Crypt((Crypt *)local_540);
      std::pair<SequenceD<64>,_SequenceD<64>_>::~pair((pair<SequenceD<64>,_SequenceD<64>_> *)&k1_1);
      break;
    case 4:
      read3DESKeys((pair<SequenceD<64>,_SequenceD<64>_> *)&k1_2,(string *)&options);
      ptVar3 = std::get<0ul,SequenceD<64>,SequenceD<64>>
                         ((pair<SequenceD<64>,_SequenceD<64>_> *)&k1_2);
      decrypt.m_k2.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node =
           (_Map_pointer)
           std::get<1ul,SequenceD<64>,SequenceD<64>>((pair<SequenceD<64>,_SequenceD<64>_> *)&k1_2);
      Decrypt::Decrypt((Decrypt *)local_810,ptVar3,
                       (SequenceD<64> *)
                       decrypt.m_k2.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&options.inputFile.field_2 + 8));
      if (bVar1) {
        Decrypt::operator()((Decrypt *)local_810,(string *)((long)&options.keyFile.field_2 + 8),
                            (ostream *)&std::cout);
      }
      else {
        Decrypt::operator()((Decrypt *)local_810,(string *)((long)&options.keyFile.field_2 + 8),
                            (string *)((long)&options.inputFile.field_2 + 8));
      }
      Decrypt::~Decrypt((Decrypt *)local_810);
      std::pair<SequenceD<64>,_SequenceD<64>_>::~pair((pair<SequenceD<64>,_SequenceD<64>_> *)&k1_2);
    }
    argv_local._4_4_ = 0;
  }
  else {
    argv_local._4_4_ = 1;
  }
  ParsedOptions::~ParsedOptions((ParsedOptions *)local_100);
  Parser::~Parser((Parser *)((long)&options.outputFile.field_2 + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    Parser parser(argc, argv);
    auto options = parser.parse();

    if (options.error) {
        return EXIT_FAILURE;
    }

    switch (options.command) {
        case HELP:
            std::cout << "Usage:" << std::endl;
            std::cout << std::endl;
            std::cout << "       3des [--key-gen] [-i <fichier>] [-c <fichier>] [-d <fichier>] [-O <fichier>]" << std::endl;
            std::cout << std::endl;
            std::cout << "Arguments:" << std::endl;
            std::cout << std::endl;
            std::cout << "  --key-gen" << std::endl;
            std::cout << "       Permet de generer une nouvelle clef de chiffrement et l'affiche sur la sortie standard." << std::endl;
            std::cout << std::endl;
            std::cout << "  -i <fichier>" << std::endl;
            std::cout << "       Permet de specifier une clef utilisee pour le chiffrement ou le dechiffrement." << std::endl;
            std::cout << std::endl;
            std::cout << "  -c <fichier>" << std::endl;
            std::cout << "       Permet de chiffrer un fichier a l'aide d'une clef (specifiee par le flag -i)." << std::endl;
            std::cout << "       Par defaut, ecrit le resultat dans la sortie standard." << std::endl;
            std::cout << std::endl;
            std::cout << "  -d <fichier>" << std::endl;
            std::cout << "       Permet de dechiffrer un fichier a l'aide d'une clef (specifiee par le flag -i)." << std::endl;
            std::cout << "       Par defaut, ecrit le resultat dans la sortie standard." << std::endl;
            std::cout << std::endl;
            std::cout << "  -O <fichier>" << std::endl;
            std::cout << "      Permet d'ecrire le resultat d'une sous commande vers un nouveau fichier plutot que" << std::endl;
            std::cout << "      dans la sortie standard." << std::endl;
            std::cout << std::endl;
            std::cout << "  -h / --help" << std::endl;
            std::cout << "      Affiche ce message d'aide et se termine." << std::endl;
            std::cout << std::endl;
            std::cout << "Exemple:" << std::endl;
            std::cout << std::endl;
            std::cout << "      ./3des -i ~/3des.key -c README.txt > README.3des" << std::endl;
            std::cout << std::endl;
            break;
        case KEY_GEN: {
            SequenceD<64> k1{}, k2{};
            if (options.outputFile.empty()) {
                write3DESKeys(std::cout, k1, k2);
            } else {
                write3DESKeys(options.outputFile, k1, k2);
            }
        } break;
        case CYPHER: {
            auto [k1, k2] = read3DESKeys(options.keyFile);
            Crypt crypt(k1, k2);
            if (options.outputFile.empty()) {
                crypt(options.inputFile, std::cout);
            } else {
                crypt(options.inputFile, options.outputFile);
            }
        } break;
        case DECYPHER: {
            auto [k1, k2] = read3DESKeys(options.keyFile);
            Decrypt decrypt(k1, k2);
            if (options.outputFile.empty()) {
                decrypt(options.inputFile, std::cout);
            } else {
                decrypt(options.inputFile, options.outputFile);
            }
        } break;
        case NONE:
        default:
            break;
    }

    return EXIT_SUCCESS;
}